

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O0

DWORD * __thiscall
HMISong::SendCommand
          (HMISong *this,DWORD *events,TrackInfo *track,DWORD delay,ptrdiff_t room,
          bool *sysex_noroom)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  DWORD DVar4;
  DWORD *local_60;
  BYTE *msg;
  size_t start_p;
  AutoNoteOff off;
  BYTE data2;
  BYTE data1;
  BYTE event;
  DWORD len;
  bool *sysex_noroom_local;
  ptrdiff_t room_local;
  DWORD delay_local;
  TrackInfo *track_local;
  DWORD *events_local;
  HMISong *this_local;
  
  off.Delay._2_1_ = 0;
  off.Delay._1_1_ = 0;
  if (track == this->FakeTrack) {
    NoteOffQueue::Pop(&this->NoteOffs,(AutoNoteOff *)&start_p);
    *events = delay;
    events[1] = 0;
    events[2] = start_p._4_1_ | 0x90 | (uint)start_p._5_1_ << 8;
    this_local = (HMISong *)(events + 3);
  }
  else {
    *sysex_noroom = false;
    sVar1 = track->TrackP;
    this_local = (HMISong *)events;
    if (track->TrackP < track->MaxTrackP) {
      sVar2 = track->TrackP;
      track->TrackP = sVar2 + 1;
      off.Delay._3_1_ = track->TrackBegin[sVar2];
      if (track->TrackP < track->MaxTrackP) {
        *events = delay;
        events[1] = 0;
        events[2] = 0x2000000;
        if ((((off.Delay._3_1_ == 0xf0) || (off.Delay._3_1_ == 0xff)) || (off.Delay._3_1_ == 0xf7))
           || (off.Delay._3_1_ == 0xfe)) {
          if ((off.Delay._3_1_ == 0xf0) || (off.Delay._3_1_ == 0xf7)) {
            off._4_4_ = (*this->ReadVarLen)(track);
            if (((uint)off._4_4_ < 0x5f4) && ((this->super_MIDIStreamer).DeviceType != MDEV_SNDSYS))
            {
              if ((ulong)(room << 2) <= (ulong)(off._4_4_ + 0xc)) {
                track->TrackP = sVar1;
                *sysex_noroom = true;
                return events;
              }
              local_60 = events + 3;
              if (off.Delay._3_1_ == 0xf0) {
                events[2] = off._4_4_ + 1 | 0x80000000;
                *(undefined1 *)local_60 = 0xf0;
                local_60 = (DWORD *)((long)events + 0xd);
              }
              else {
                events[2] = off._4_4_ | 0x80000000;
              }
              memcpy(local_60,track->TrackBegin + track->TrackP,(ulong)(uint)off._4_4_);
              local_60 = (DWORD *)((long)local_60 + (ulong)(uint)off._4_4_);
              while (((ulong)local_60 & 3) != 0) {
                *(undefined1 *)local_60 = 0;
                local_60 = (DWORD *)((long)local_60 + 1);
              }
              track->TrackP = (ulong)(uint)off._4_4_ + track->TrackP;
            }
            else {
              track->TrackP = (ulong)(uint)off._4_4_ + track->TrackP;
            }
          }
          else if (off.Delay._3_1_ == 0xff) {
            sVar1 = track->TrackP;
            track->TrackP = sVar1 + 1;
            off.Delay._3_1_ = track->TrackBegin[sVar1];
            if (track->MaxTrackP <= track->TrackP) {
              track->Finished = true;
              return events;
            }
            off._4_4_ = (*this->ReadVarLen)(track);
            if (track->MaxTrackP <= track->TrackP) {
              track->Finished = true;
              return events;
            }
            if (track->MaxTrackP < track->TrackP + (ulong)(uint)off._4_4_) {
              track->Finished = true;
            }
            else {
              if (off.Delay._3_1_ == 0x2f) {
                track->Finished = true;
              }
              else if (off.Delay._3_1_ == 0x51) {
                (this->super_MIDIStreamer).Tempo =
                     (uint)track->TrackBegin[track->TrackP] << 0x10 |
                     (uint)track->TrackBegin[track->TrackP + 1] << 8 |
                     (uint)track->TrackBegin[track->TrackP + 2];
                *events = delay;
                events[1] = 0;
                events[2] = (this->super_MIDIStreamer).Tempo | 0x1000000;
              }
              track->TrackP = (ulong)(uint)off._4_4_ + track->TrackP;
              if (track->TrackP == track->MaxTrackP) {
                track->Finished = true;
              }
            }
          }
          else if (off.Delay._3_1_ == 0xfe) {
            sVar1 = track->TrackP;
            track->TrackP = sVar1 + 1;
            off.Delay._3_1_ = track->TrackBegin[sVar1];
            if (track->MaxTrackP <= track->TrackP) {
              track->Finished = true;
              return events;
            }
            if ((off.Delay._3_1_ == 0x13) || (off.Delay._3_1_ == 0x15)) {
              track->TrackP = track->TrackP + 6;
            }
            else if ((off.Delay._3_1_ == 0x12) || (off.Delay._3_1_ == 0x14)) {
              track->TrackP = track->TrackP + 2;
            }
            else if (off.Delay._3_1_ == 0x10) {
              track->TrackP = track->TrackP + 2;
              if (track->MaxTrackP <= track->TrackP) {
                track->Finished = true;
                return events;
              }
              track->TrackP = (long)(int)(track->TrackBegin[track->TrackP] + 5) + track->TrackP;
              if (track->MaxTrackP <= track->TrackP) {
                track->Finished = true;
                return events;
              }
            }
            else {
              track->Finished = true;
            }
          }
        }
        else {
          if ((off.Delay._3_1_ & 0xf0) == 0xf0) {
            if ('\0' < MIDI_CommonLengths[(int)(off.Delay._3_1_ & 0xf)]) {
              sVar1 = track->TrackP;
              track->TrackP = sVar1 + 1;
              off.Delay._2_1_ = track->TrackBegin[sVar1];
              if ('\x01' < MIDI_CommonLengths[(int)(off.Delay._3_1_ & 0xf)]) {
                sVar1 = track->TrackP;
                track->TrackP = sVar1 + 1;
                off.Delay._1_1_ = track->TrackBegin[sVar1];
              }
            }
          }
          else if ((off.Delay._3_1_ & 0x80) == 0) {
            off.Delay._2_1_ = off.Delay._3_1_;
            off.Delay._3_1_ = track->RunningStatus;
          }
          else {
            track->RunningStatus = off.Delay._3_1_;
            sVar1 = track->TrackP;
            track->TrackP = sVar1 + 1;
            off.Delay._2_1_ = track->TrackBegin[sVar1];
          }
          if (track->MaxTrackP <= track->TrackP) {
            track->Finished = true;
            return events;
          }
          if (MIDI_EventLengths[(int)(off.Delay._3_1_ & 0x70) >> 4] == '\x02') {
            sVar1 = track->TrackP;
            track->TrackP = sVar1 + 1;
            off.Delay._1_1_ = track->TrackBegin[sVar1];
          }
          if (((off.Delay._3_1_ & 0x70) == 0x30) && (off.Delay._2_1_ == 7)) {
            iVar3 = MIDIStreamer::VolumeControllerChange
                              (&this->super_MIDIStreamer,off.Delay._3_1_ & 0xf,(uint)off.Delay._1_1_
                              );
            off.Delay._1_1_ = (byte)iVar3;
          }
          if (off.Delay._3_1_ != 0xff) {
            events[2] = (uint)CONCAT12(off.Delay._1_1_,CONCAT11(off.Delay._2_1_,off.Delay._3_1_));
          }
          if ((this->ReadVarLen == ReadVarLenHMI) && ((off.Delay._3_1_ & 0x70) == 0x10)) {
            DVar4 = TrackInfo::ReadVarLenHMI(track);
            NoteOffQueue::AddNoteOff(&this->NoteOffs,DVar4,off.Delay._3_1_ & 0xf,off.Delay._2_1_);
          }
        }
        if ((track->Finished & 1U) == 0) {
          DVar4 = (*this->ReadVarLen)(track);
          track->Delay = DVar4;
        }
        if ((*events != 0) || (track_local = (TrackInfo *)events, events[2] >> 0x18 != 2)) {
          if (events[2] >> 0x18 == 0x80) {
            track_local = (TrackInfo *)(events + (((events[2] & 0xffffff) + 3 >> 2) + 3));
          }
          else {
            track_local = (TrackInfo *)(events + 3);
          }
        }
        this_local = (HMISong *)track_local;
      }
      else {
        track->Finished = true;
      }
    }
    else {
      track->Finished = true;
    }
  }
  return (DWORD *)this_local;
}

Assistant:

DWORD *HMISong::SendCommand (DWORD *events, TrackInfo *track, DWORD delay, ptrdiff_t room, bool &sysex_noroom)
{
	DWORD len;
	BYTE event, data1 = 0, data2 = 0;

	// If the next event comes from the fake track, pop an entry off the note-off queue.
	if (track == FakeTrack)
	{
		AutoNoteOff off;
		NoteOffs.Pop(off);
		events[0] = delay;
		events[1] = 0;
		events[2] = MIDI_NOTEON | off.Channel | (off.Key << 8);
		return events + 3;
	}

	sysex_noroom = false;
	size_t start_p = track->TrackP;

	CHECK_FINISHED
	event = track->TrackBegin[track->TrackP++];
	CHECK_FINISHED

	// The actual event type will be filled in below. If it's not a NOP,
	// the events pointer will be advanced once the actual event is written.
	// Otherwise, we do it at the end of the function.
	events[0] = delay;
	events[1] = 0;
	events[2] = MEVT_NOP << 24;

	if (event != MIDI_SYSEX && event != MIDI_META && event != MIDI_SYSEXEND && event != 0xFe)
	{
		// Normal short message
		if ((event & 0xF0) == 0xF0)
		{
			if (MIDI_CommonLengths[event & 15] > 0)
			{
				data1 = track->TrackBegin[track->TrackP++];
				if (MIDI_CommonLengths[event & 15] > 1)
				{
					data2 = track->TrackBegin[track->TrackP++];
				}
			}
		}
		else if ((event & 0x80) == 0)
		{
			data1 = event;
			event = track->RunningStatus;
		}
		else
		{
			track->RunningStatus = event;
			data1 = track->TrackBegin[track->TrackP++];
		}

		CHECK_FINISHED

		if (MIDI_EventLengths[(event&0x70)>>4] == 2)
		{
			data2 = track->TrackBegin[track->TrackP++];
		}

		// Monitor channel volume controller changes.
		if ((event & 0x70) == (MIDI_CTRLCHANGE & 0x70) && data1 == 7)
		{
			data2 = VolumeControllerChange(event & 15, data2);
		}

		if (event != MIDI_META)
		{
			events[2] = event | (data1<<8) | (data2<<16);
		}

		if (ReadVarLen == ReadVarLenHMI && (event & 0x70) == (MIDI_NOTEON & 0x70))
		{ // HMI note on events include the time until an implied note off event.
			NoteOffs.AddNoteOff(track->ReadVarLenHMI(), event & 0x0F, data1);
		}
	}
	else
	{
		// SysEx events could potentially not have enough room in the buffer...
		if (event == MIDI_SYSEX || event == MIDI_SYSEXEND)
		{
			len = ReadVarLen(track);
			if (len >= (MAX_EVENTS-1)*3*4 || DeviceType == MDEV_SNDSYS)
			{ // This message will never fit. Throw it away.
				track->TrackP += len;
			}
			else if (len + 12 >= (size_t)room * 4)
			{ // Not enough room left in this buffer. Backup and wait for the next one.
				track->TrackP = start_p;
				sysex_noroom = true;
				return events;
			}
			else
			{
				BYTE *msg = (BYTE *)&events[3];
				if (event == MIDI_SYSEX)
				{ // Need to add the SysEx marker to the message.
					events[2] = (MEVT_LONGMSG << 24) | (len + 1);
					*msg++ = MIDI_SYSEX;
				}
				else
				{
					events[2] = (MEVT_LONGMSG << 24) | len;
				}
				memcpy(msg, &track->TrackBegin[track->TrackP], len);
				msg += len;
				// Must pad with 0
				while ((size_t)msg & 3)
				{
					*msg++ = 0;
				}
				track->TrackP += len;
			}
		}
		else if (event == MIDI_META)
		{
			// It's a meta-event
			event = track->TrackBegin[track->TrackP++];
			CHECK_FINISHED
			len = ReadVarLen(track);
			CHECK_FINISHED

			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					Tempo =
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2]);
					events[0] = delay;
					events[1] = 0;
					events[2] = (MEVT_TEMPO << 24) | Tempo;
					break;
				}
				track->TrackP += len;
				if (track->TrackP == track->MaxTrackP)
				{
					track->Finished = true;
				}
			}
			else
			{
				track->Finished = true;
			}
		}
		else if (event == 0xFE)
		{ // Skip unknown HMI events.
			event = track->TrackBegin[track->TrackP++];
			CHECK_FINISHED
			if (event == 0x13 || event == 0x15)
			{
				track->TrackP += 6;
			}
			else if (event == 0x12 || event == 0x14)
			{
				track->TrackP += 2;
			}
			else if (event == 0x10)
			{
				track->TrackP += 2;
				CHECK_FINISHED
				track->TrackP += track->TrackBegin[track->TrackP] + 5;
				CHECK_FINISHED
			}
			else
			{ // No idea.
				track->Finished = true;
			}
		}